

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrGLContext.cpp
# Opt level: O2

void __thiscall
sglr::GLContext::genVertexArrays(GLContext *this,int numArrays,deUint32 *vertexArrays)

{
  glu::CallLogWrapper::glGenVertexArrays(this->m_wrapper,numArrays,vertexArrays);
  if (0 < numArrays) {
    std::
    _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
    ::_M_insert_range_unique<unsigned_int*>
              ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                *)&this->m_allocatedVaos,vertexArrays,vertexArrays + (uint)numArrays);
    return;
  }
  return;
}

Assistant:

void GLContext::genVertexArrays (int numArrays, deUint32* vertexArrays)
{
	m_wrapper->glGenVertexArrays(numArrays, vertexArrays);
	if (numArrays > 0)
		m_allocatedVaos.insert(vertexArrays, vertexArrays+numArrays);
}